

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int EVP_HPKE_CTX_setup_recipient
              (EVP_HPKE_CTX *ctx,EVP_HPKE_KEY *key,EVP_HPKE_KDF *kdf,EVP_HPKE_AEAD *aead,
              uint8_t *enc,size_t enc_len,uint8_t *info,size_t info_len)

{
  int iVar1;
  size_t local_70;
  size_t shared_secret_len;
  uint8_t shared_secret [32];
  size_t enc_len_local;
  uint8_t *enc_local;
  EVP_HPKE_AEAD *aead_local;
  EVP_HPKE_KDF *kdf_local;
  EVP_HPKE_KEY *key_local;
  EVP_HPKE_CTX *ctx_local;
  
  EVP_HPKE_CTX_zero(ctx);
  ctx->is_sender = 0;
  ctx->kem = key->kem;
  ctx->kdf = kdf;
  ctx->aead = aead;
  iVar1 = (*key->kem->decap)(key,(uint8_t *)&shared_secret_len,&local_70,enc,enc_len);
  if ((iVar1 != 0) &&
     (iVar1 = hpke_key_schedule(ctx,'\0',(uint8_t *)&shared_secret_len,local_70,info,info_len),
     iVar1 != 0)) {
    return 1;
  }
  EVP_HPKE_CTX_cleanup(ctx);
  return 0;
}

Assistant:

int EVP_HPKE_CTX_setup_recipient(EVP_HPKE_CTX *ctx, const EVP_HPKE_KEY *key,
                                 const EVP_HPKE_KDF *kdf,
                                 const EVP_HPKE_AEAD *aead, const uint8_t *enc,
                                 size_t enc_len, const uint8_t *info,
                                 size_t info_len) {
  EVP_HPKE_CTX_zero(ctx);
  ctx->is_sender = 0;
  ctx->kem = key->kem;
  ctx->kdf = kdf;
  ctx->aead = aead;
  uint8_t shared_secret[MAX_SHARED_SECRET_LEN];
  size_t shared_secret_len;
  if (!key->kem->decap(key, shared_secret, &shared_secret_len, enc, enc_len) ||
      !hpke_key_schedule(ctx, HPKE_MODE_BASE, shared_secret, shared_secret_len,
                         info, info_len)) {
    EVP_HPKE_CTX_cleanup(ctx);
    return 0;
  }
  return 1;
}